

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Symbol.hh
# Opt level: O1

void __thiscall
avro::parsing::SimpleParser<avro::parsing::ResolvingDecoderHandler>::reset
          (SimpleParser<avro::parsing::ResolvingDecoderHandler> *this)

{
  _Map_pointer ppSVar1;
  
  while (ppSVar1 = (this->parsingStack).c.
                   super__Deque_base<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>.
                   _M_impl.super__Deque_impl_data._M_finish._M_node,
        1 < ((long)(this->parsingStack).c.
                   super__Deque_base<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>.
                   _M_impl.super__Deque_impl_data._M_start._M_last -
             (long)(this->parsingStack).c.
                   super__Deque_base<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>.
                   _M_impl.super__Deque_impl_data._M_start._M_cur >> 4) +
            ((long)(this->parsingStack).c.
                   super__Deque_base<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>.
                   _M_impl.super__Deque_impl_data._M_finish._M_cur -
             (long)(this->parsingStack).c.
                   super__Deque_base<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>.
                   _M_impl.super__Deque_impl_data._M_finish._M_first >> 4) +
            ((((ulong)((long)ppSVar1 -
                      (long)(this->parsingStack).c.
                            super__Deque_base<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>
                            ._M_impl.super__Deque_impl_data._M_start._M_node) >> 3) - 1) +
            (ulong)(ppSVar1 == (_Map_pointer)0x0)) * 0x20) {
    std::deque<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>::pop_back
              (&(this->parsingStack).c);
  }
  return;
}

Assistant:

void reset() {
        while (parsingStack.size() > 1) {
            parsingStack.pop();
        }
    }